

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGBT,cBGRA,bCopy>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  undefined2 uVar2;
  int iVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  BYTE *pBVar15;
  byte *pbVar16;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_00585fdd_caseD_0:
    lVar12 = 0;
    if (count < 1) {
      count = 0;
    }
    pBVar15 = pin + 2;
    for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
      if (((pBVar15[-2] != tr) || (pBVar15[-1] != tg)) || (*pBVar15 != tb)) {
        pout[lVar12 * 4 + 2] = pBVar15[-2];
        pout[lVar12 * 4 + 1] = pBVar15[-1];
        pout[lVar12 * 4] = *pBVar15;
        pout[lVar12 * 4 + 3] = 0xff;
      }
      pBVar15 = pBVar15 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_00585fdd_caseD_0;
    case BLEND_ICEMAP:
      uVar10 = 0;
      uVar14 = (ulong)(uint)count;
      if (count < 1) {
        uVar14 = uVar10;
      }
      for (; (int)uVar14 != (int)uVar10; uVar10 = uVar10 + 1) {
        if (((*pin != tr) || (pin[1] != tg)) || (pin[2] != tb)) {
          iVar7 = cRGBT::Gray(pin);
          pout[uVar10 * 4 + 2] = IcePalette[iVar7 >> 4][0];
          *(ushort *)(pout + uVar10 * 4) =
               *(ushort *)(IcePalette[iVar7 >> 4] + 1) << 8 |
               *(ushort *)(IcePalette[iVar7 >> 4] + 1) >> 8;
          pout[uVar10 * 4 + 3] = 0xff;
        }
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar12 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar16 = pin + 2;
      for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
        bVar11 = pbVar16[-1];
        if ((pbVar16[-1] != tg || pbVar16[-2] != tr) || (bVar11 = tg, *pbVar16 != tb)) {
          iVar7 = inf->blendcolor[3];
          iVar8 = inf->blendcolor[1];
          bVar1 = *pbVar16;
          iVar3 = inf->blendcolor[2];
          pout[lVar12 * 4 + 2] = (BYTE)((uint)pbVar16[-2] * iVar7 + inf->blendcolor[0] >> 0x10);
          pout[lVar12 * 4 + 1] = (BYTE)((uint)bVar11 * iVar7 + iVar8 >> 0x10);
          pout[lVar12 * 4] = (BYTE)((uint)bVar1 * iVar7 + iVar3 >> 0x10);
          pout[lVar12 * 4 + 3] = 0xff;
        }
        pbVar16 = pbVar16 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar12 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar16 = pin + 2;
      for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
        bVar11 = pbVar16[-1];
        if ((pbVar16[-1] != tg || pbVar16[-2] != tr) || (bVar11 = tg, *pbVar16 != tb)) {
          iVar7 = inf->blendcolor[1];
          bVar1 = *pbVar16;
          iVar8 = inf->blendcolor[2];
          pout[lVar12 * 4 + 2] = (BYTE)((uint)pbVar16[-2] * inf->blendcolor[0] >> 0x10);
          pout[lVar12 * 4 + 1] = (BYTE)((uint)bVar11 * iVar7 >> 0x10);
          pout[lVar12 * 4] = (BYTE)((uint)bVar1 * iVar8 >> 0x10);
          pout[lVar12 * 4 + 3] = 0xff;
        }
        pbVar16 = pbVar16 + step;
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar12 = (long)EVar4;
      if (lVar12 < 0x21) {
        if (BLEND_ICEMAP < EVar4) {
          iVar7 = 0x20 - EVar4;
          uVar10 = 0;
          uVar14 = (ulong)(uint)count;
          if (count < 1) {
            uVar14 = uVar10;
          }
          for (; (int)uVar14 != (int)uVar10; uVar10 = uVar10 + 1) {
            if (((*pin != tr) || (pin[1] != tg)) || (pin[2] != tb)) {
              iVar8 = cRGBT::Gray(pin);
              iVar8 = iVar8 * (EVar4 + BLEND_MODULATE);
              bVar11 = pin[1];
              bVar1 = pin[2];
              pout[uVar10 * 4 + 2] = (BYTE)((int)((uint)*pin * iVar7 + iVar8) / 0x1f);
              pout[uVar10 * 4 + 1] = (BYTE)((int)((uint)bVar11 * iVar7 + iVar8) / 0x1f);
              pout[uVar10 * 4] = (BYTE)((int)((uint)bVar1 * iVar7 + iVar8) / 0x1f);
              pout[uVar10 * 4 + 3] = 0xff;
            }
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
          if (((*pin != tr) || (pin[1] != tg)) || (pin[2] != tb)) {
            uVar6 = cRGBT::Gray(pin);
            uVar9 = 0xff;
            if (uVar6 < 0xff) {
              uVar9 = uVar6;
            }
            if ((int)uVar6 < 1) {
              uVar9 = 0;
            }
            uVar2 = *(undefined2 *)((long)pFVar5 + (ulong)uVar9 * 4 + lVar12 * 0x518 + -0xa700);
            pout[lVar13 * 4 + 2] =
                 *(BYTE *)((long)pFVar5 + (ulong)uVar9 * 4 + lVar12 * 0x518 + -0xa6fe);
            *(undefined2 *)(pout + lVar13 * 4) = uVar2;
            pout[lVar13 * 4 + 3] = 0xff;
          }
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}